

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPHandler.h
# Opt level: O0

void __thiscall HTTPHandler<Client>::handle(HTTPHandler<Client> *this,Client *client)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  istream *in_RSI;
  long in_RDI;
  Response *in_stack_00000028;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_00000030;
  Response resp;
  Request request;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  Request *in_stack_00000258;
  Response *in_stack_00000260;
  Request *in_stack_fffffffffffffda8;
  Response *in_stack_fffffffffffffdb0;
  path *in_stack_fffffffffffffdb8;
  path *in_stack_fffffffffffffdc0;
  allocator<char> *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  Request *this_01;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  undefined1 local_39 [57];
  
  this_01 = (Request *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  Client::read_until<std::__cxx11::stringstream>
            ((Client *)in_stack_fffffffffffffe68,(string *)in_stack_fffffffffffffe60);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x108401);
  if (bVar1) {
    std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffdb0);
    Request::Request(this_01,in_RSI);
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 0x30),"---------- Request ----------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = operator<<((ostream *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"-----------------------------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::filesystem::__cxx11::path::path(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    Response::Response(in_stack_00000260,in_stack_00000258,(path *)this);
    std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffdb0);
    sVar3 = Response::get_content_length((Response *)&stack0xfffffffffffffe50);
    if (sVar3 < 200) {
      poVar2 = std::operator<<(*(ostream **)(in_RDI + 0x30),"---------- Response ----------");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_00 = operator<<(in_stack_00000030,in_stack_00000028);
      poVar2 = (ostream *)std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffffdb0 =
           (Response *)std::operator<<(poVar2,"------------------------------");
      std::ostream::operator<<(in_stack_fffffffffffffdb0,std::endl<char,std::char_traits<char>>);
    }
    operator<<((Client *)in_stack_00000030,in_stack_00000028);
    Response::~Response(in_stack_fffffffffffffdb0);
    Request::~Request((Request *)in_stack_fffffffffffffdb0);
  }
  std::
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffdb0);
  return;
}

Assistant:

void HTTPHandler<T>::handle(T&& client) {
    auto result = client.read_until("\r\n\r\n");

    if (!result) {
        return;
    }

    Request request(*result);
    stream << "---------- Request ----------" << std::endl
           << request                         << std::endl
           << "-----------------------------" << std::endl;

    Response resp(request, resolve_path);
    if (resp.get_content_length() < 200) {
        stream << "---------- Response ----------" << std::endl
               << resp                             << std::endl
               << "------------------------------" << std::endl;
    }

    client << resp;
}